

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O0

void ** CP_consolidateDataToRankZero
                  (SstStream Stream,void *LocalInfo,FFSTypeHandle Type,void **RetDataBlock)

{
  size_t *displs;
  undefined8 uVar1;
  SMPI_Comm comm;
  undefined8 *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  int i_1;
  FFSContext context;
  int RoundUp;
  int i;
  int TotalLen;
  char *RecvBuffer;
  size_t *Displs;
  _CP_DP_init_info **Pointers;
  char *Buffer;
  size_t *RecvCounts;
  size_t DataSize;
  FFSBuffer Buf;
  undefined8 in_stack_ffffffffffffff78;
  SMPI_Datatype in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int iVar2;
  void *in_stack_ffffffffffffff90;
  SMPI_Datatype in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  SMPI_Comm in_stack_ffffffffffffffa8;
  void *pvVar3;
  undefined8 *__ptr;
  void **ppvVar4;
  undefined8 *local_38;
  undefined1 local_30 [8];
  size_t *local_28;
  undefined8 *local_20;
  undefined8 local_18;
  undefined8 local_10;
  long *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  displs = (size_t *)create_FFSBuffer();
  local_38 = (undefined8 *)0x0;
  ppvVar4 = (void **)0x0;
  local_28 = displs;
  uVar1 = FMFormat_of_original(local_18);
  comm = (SMPI_Comm)FFSencode(displs,uVar1,local_10,local_30);
  if ((int)local_8[0x15] == 0) {
    local_38 = (undefined8 *)malloc((long)*(int *)((long)local_8 + 0xac) << 3);
  }
  SMPI_Gather(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,displs,
              (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
              (SMPI_Datatype)in_stack_ffffffffffffff78,in_stack_ffffffffffffffa0,
              in_stack_ffffffffffffffa8);
  __ptr = (undefined8 *)0x0;
  pvVar3 = (void *)0x0;
  if ((int)local_8[0x15] == 0) {
    __ptr = (undefined8 *)malloc((long)*(int *)((long)local_8 + 0xac) << 3);
    *__ptr = 0;
    in_stack_ffffffffffffffa4 = (int)*local_38 + 7U & 0xfffffff8;
    for (in_stack_ffffffffffffffa0 = 1; in_stack_ffffffffffffffa0 < *(int *)((long)local_8 + 0xac);
        in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 + 1) {
      in_stack_ffffffffffffff9c = (int)local_38[in_stack_ffffffffffffffa0] + 7U & 0xfffffff8;
      __ptr[in_stack_ffffffffffffffa0] = (long)(int)in_stack_ffffffffffffffa4;
      in_stack_ffffffffffffffa4 = in_stack_ffffffffffffff9c + in_stack_ffffffffffffffa4;
    }
    pvVar3 = malloc((long)(int)in_stack_ffffffffffffffa4);
  }
  SMPI_Gatherv((void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               (size_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),displs,
               (SMPI_Datatype)__ptr,(int)ppvVar4,comm);
  free_FFSBuffer(local_28);
  if ((int)local_8[0x15] == 0) {
    uVar1 = *(undefined8 *)(*local_8 + 8);
    ppvVar4 = (void **)malloc((long)*(int *)((long)local_8 + 0xac) << 3);
    for (iVar2 = 0; iVar2 < *(int *)((long)local_8 + 0xac); iVar2 = iVar2 + 1) {
      FFSdecode_in_place(uVar1,(long)pvVar3 + __ptr[iVar2],ppvVar4 + iVar2);
    }
    free(__ptr);
    free(local_38);
  }
  *local_20 = pvVar3;
  return ppvVar4;
}

Assistant:

void **CP_consolidateDataToRankZero(SstStream Stream, void *LocalInfo, FFSTypeHandle Type,
                                    void **RetDataBlock)
{
    FFSBuffer Buf = create_FFSBuffer();
    size_t DataSize;
    size_t *RecvCounts = NULL;
    char *Buffer;

    struct _CP_DP_init_info **Pointers = NULL;

    Buffer = FFSencode(Buf, FMFormat_of_original(Type), LocalInfo, &DataSize);

    if (Stream->Rank == 0)
    {
        RecvCounts = malloc(Stream->CohortSize * sizeof(*RecvCounts));
    }
    SMPI_Gather(&DataSize, 1, SMPI_SIZE_T, RecvCounts, 1, SMPI_SIZE_T, 0, Stream->mpiComm);

    /*
     * Figure out the total length of block
     * and displacements for each rank
     */

    size_t *Displs = NULL;
    char *RecvBuffer = NULL;

    if (Stream->Rank == 0)
    {
        int TotalLen = 0;
        Displs = malloc(Stream->CohortSize * sizeof(*Displs));

        Displs[0] = 0;
        TotalLen = (RecvCounts[0] + 7) & ~7;

        for (int i = 1; i < Stream->CohortSize; i++)
        {
            int RoundUp = (RecvCounts[i] + 7) & ~7;
            Displs[i] = TotalLen;
            TotalLen += RoundUp;
        }

        RecvBuffer = malloc(TotalLen * sizeof(char));
    }

    /*
     * Now we have the receive buffer, counts, and displacements, and
     * can gather the data
     */

    SMPI_Gatherv(Buffer, (int)DataSize, SMPI_CHAR, RecvBuffer, RecvCounts, Displs, SMPI_CHAR, 0,
                 Stream->mpiComm);
    free_FFSBuffer(Buf);

    if (Stream->Rank == 0)
    {
        FFSContext context = Stream->CPInfo->ffs_c;
        //        FFSTypeHandle ffs_type = FFSTypeHandle_from_encode(context,
        //        RecvBuffer);

        int i;
        Pointers = malloc(Stream->CohortSize * sizeof(Pointers[0]));
        for (i = 0; i < Stream->CohortSize; i++)
        {
            FFSdecode_in_place(context, RecvBuffer + Displs[i], (void **)&Pointers[i]);
            // printf("Decode for rank %d :\n", i);
            // FMdump_data(FMFormat_of_original(ffs_type), Pointers[i],
            // 1024000);
        }
        free(Displs);
        free(RecvCounts);
    }
    *RetDataBlock = RecvBuffer;
    return (void **)Pointers;
}